

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_comparison.cpp
# Opt level: O3

idx_t duckdb::TemplatedSelectOperation<duckdb::GreaterThan>
                (Vector *left,Vector *right,optional_ptr<const_duckdb::SelectionVector,_true> sel,
                idx_t count,optional_ptr<duckdb::SelectionVector,_true> true_sel,
                optional_ptr<duckdb::SelectionVector,_true> false_sel,
                optional_ptr<duckdb::ValidityMask,_true> null_mask)

{
  PhysicalType PVar1;
  optional_ptr<duckdb::ValidityMask,_true> null_mask_00;
  optional_ptr<duckdb::SelectionVector,_true> target;
  idx_t iVar2;
  InternalException *this;
  SelectionVector maybe_vec;
  SelectionVector false_vec;
  SelectionVector true_vec;
  OptionalSelection false_opt;
  OptionalSelection true_opt;
  Vector l_not_null;
  optional_ptr<const_duckdb::SelectionVector,_true> local_1a0;
  optional_ptr<duckdb::ValidityMask,_true> local_198;
  optional_ptr<duckdb::SelectionVector,_true> local_190;
  SelectionVector local_188;
  SelectionVector local_170;
  SelectionVector local_158;
  OptionalSelection local_140;
  OptionalSelection local_120;
  Vector local_100;
  Vector local_98;
  
  local_198 = (optional_ptr<duckdb::ValidityMask,_true>)
              (optional_ptr<duckdb::ValidityMask,_true>)null_mask.ptr;
  if (null_mask.ptr != (ValidityMask *)0x0) {
    optional_ptr<duckdb::ValidityMask,_true>::CheckValid(&local_198);
    UpdateNullMask(left,sel,count,local_198.ptr);
    optional_ptr<duckdb::ValidityMask,_true>::CheckValid(&local_198);
    UpdateNullMask(right,sel,count,local_198.ptr);
  }
  null_mask_00.ptr = local_198.ptr;
  PVar1 = (left->type).physical_type_;
  if (PVar1 < VARCHAR) {
    switch(PVar1) {
    case BOOL:
    case INT8:
      iVar2 = BinaryExecutor::Select<signed_char,signed_char,duckdb::GreaterThan>
                        (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
      break;
    case UINT8:
      iVar2 = BinaryExecutor::Select<unsigned_char,unsigned_char,duckdb::GreaterThan>
                        (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
      break;
    case UINT16:
      iVar2 = BinaryExecutor::Select<unsigned_short,unsigned_short,duckdb::GreaterThan>
                        (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
      break;
    case INT16:
      iVar2 = BinaryExecutor::Select<short,short,duckdb::GreaterThan>
                        (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
      break;
    case UINT32:
      iVar2 = BinaryExecutor::Select<unsigned_int,unsigned_int,duckdb::GreaterThan>
                        (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
      break;
    case INT32:
      iVar2 = BinaryExecutor::Select<int,int,duckdb::GreaterThan>
                        (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
      break;
    case UINT64:
      iVar2 = BinaryExecutor::Select<unsigned_long,unsigned_long,duckdb::GreaterThan>
                        (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
      break;
    case INT64:
      iVar2 = BinaryExecutor::Select<long,long,duckdb::GreaterThan>
                        (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
      break;
    default:
switchD_003c510f_caseD_a:
      this = (InternalException *)__cxa_allocate_exception(0x10);
      local_100._0_8_ = &local_100.type.type_info_;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_100,"Invalid type for comparison","");
      InternalException::InternalException(this,(string *)&local_100);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case FLOAT:
      iVar2 = BinaryExecutor::Select<float,float,duckdb::GreaterThan>
                        (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
      break;
    case DOUBLE:
      iVar2 = BinaryExecutor::Select<double,double,duckdb::GreaterThan>
                        (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
      break;
    case INTERVAL:
      iVar2 = BinaryExecutor::Select<duckdb::interval_t,duckdb::interval_t,duckdb::GreaterThan>
                        (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
      break;
    case LIST:
    case STRUCT:
    case ARRAY:
      local_1a0.ptr = sel.ptr;
      local_190.ptr = false_sel.ptr;
      if (sel.ptr == (SelectionVector *)0x0) {
        local_1a0.ptr = FlatVector::IncrementalSelectionVector();
      }
      SelectionVector::SelectionVector(&local_158,count);
      OptionalSelection::OptionalSelection(&local_120,&local_158);
      SelectionVector::SelectionVector(&local_170,count);
      OptionalSelection::OptionalSelection(&local_140,&local_170);
      target.ptr = local_190.ptr;
      SelectionVector::SelectionVector(&local_188,count);
      Vector::Vector(&local_100,left);
      Vector::Vector(&local_98,right);
      optional_ptr<const_duckdb::SelectionVector,_true>::CheckValid(&local_1a0);
      iVar2 = SelectNotNull(&local_100,&local_98,count,local_1a0.ptr,&local_188,&local_140,
                            null_mask_00);
      iVar2 = VectorOperations::DistinctGreaterThan
                        (&local_100,&local_98,&local_188,iVar2,
                         (optional_ptr<duckdb::SelectionVector,_true>)local_120.sel,
                         (optional_ptr<duckdb::SelectionVector,_true>)local_140.sel,null_mask_00);
      ScatterSelection(true_sel,iVar2,&local_158);
      ScatterSelection(target,count - iVar2,&local_170);
      if (local_98.auxiliary.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.auxiliary.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_98.buffer.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.buffer.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      LogicalType::~LogicalType(&local_98.type);
      if (local_100.auxiliary.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_100.auxiliary.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_100.buffer.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_100.buffer.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)((long)&local_100 + 8));
      if (local_188.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_188.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_140.vec.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_140.vec.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_170.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_170.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_120.vec.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_120.vec.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_158.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_158.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
  }
  else if (PVar1 == VARCHAR) {
    iVar2 = BinaryExecutor::Select<duckdb::string_t,duckdb::string_t,duckdb::GreaterThan>
                      (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
  }
  else if (PVar1 == UINT128) {
    iVar2 = BinaryExecutor::Select<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::GreaterThan>
                      (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
  }
  else {
    if (PVar1 != INT128) goto switchD_003c510f_caseD_a;
    iVar2 = BinaryExecutor::Select<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::GreaterThan>
                      (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
  }
  return iVar2;
}

Assistant:

static idx_t TemplatedSelectOperation(Vector &left, Vector &right, optional_ptr<const SelectionVector> sel, idx_t count,
                                      optional_ptr<SelectionVector> true_sel, optional_ptr<SelectionVector> false_sel,
                                      optional_ptr<ValidityMask> null_mask) {
	if (null_mask) {
		UpdateNullMask(left, sel, count, *null_mask);
		UpdateNullMask(right, sel, count, *null_mask);
	}
	switch (left.GetType().InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		return BinaryExecutor::Select<int8_t, int8_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get());
	case PhysicalType::INT16:
		return BinaryExecutor::Select<int16_t, int16_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                    false_sel.get());
	case PhysicalType::INT32:
		return BinaryExecutor::Select<int32_t, int32_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                    false_sel.get());
	case PhysicalType::INT64:
		return BinaryExecutor::Select<int64_t, int64_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                    false_sel.get());
	case PhysicalType::UINT8:
		return BinaryExecutor::Select<uint8_t, uint8_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                    false_sel.get());
	case PhysicalType::UINT16:
		return BinaryExecutor::Select<uint16_t, uint16_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                      false_sel.get());
	case PhysicalType::UINT32:
		return BinaryExecutor::Select<uint32_t, uint32_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                      false_sel.get());
	case PhysicalType::UINT64:
		return BinaryExecutor::Select<uint64_t, uint64_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                      false_sel.get());
	case PhysicalType::INT128:
		return BinaryExecutor::Select<hugeint_t, hugeint_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                        false_sel.get());
	case PhysicalType::UINT128:
		return BinaryExecutor::Select<uhugeint_t, uhugeint_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                          false_sel.get());
	case PhysicalType::FLOAT:
		return BinaryExecutor::Select<float, float, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get());
	case PhysicalType::DOUBLE:
		return BinaryExecutor::Select<double, double, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get());
	case PhysicalType::INTERVAL:
		return BinaryExecutor::Select<interval_t, interval_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                          false_sel.get());
	case PhysicalType::VARCHAR:
		return BinaryExecutor::Select<string_t, string_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                      false_sel.get());
	case PhysicalType::LIST:
	case PhysicalType::STRUCT:
	case PhysicalType::ARRAY:
		return NestedSelectOperation<OP>(left, right, sel, count, true_sel, false_sel, null_mask);
	default:
		throw InternalException("Invalid type for comparison");
	}
}